

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

bool __thiscall
duckdb::LocalFileSystem::ListFiles
          (LocalFileSystem *this,string *directory,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          *callback,FileOpener *opener)

{
  bool bVar1;
  int iVar2;
  char *__name;
  DIR *__p;
  dirent *pdVar3;
  string full_path;
  string name;
  unique_ptr<__dirstream,_std::function<void_(__dirstream_*)>_> dir_unique_ptr;
  stat status;
  allocator local_141;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *local_140;
  FileSystem *local_138;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  unique_ptr<__dirstream,_std::function<void_(__dirstream_*)>_> local_f0;
  undefined1 local_c8 [152];
  
  local_140 = callback;
  local_138 = &this->super_FileSystem;
  __name = NormalizeLocalPath(directory);
  __p = opendir(__name);
  if (__p != (DIR *)0x0) {
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    local_c8._24_8_ =
         std::
         _Function_handler<void_(__dirstream_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:674:71)>
         ::_M_invoke;
    local_c8._16_8_ =
         std::
         _Function_handler<void_(__dirstream_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:674:71)>
         ::_M_manager;
    ::std::__uniq_ptr_impl<__dirstream,std::function<void(__dirstream*)>>::
    __uniq_ptr_impl<std::function<void(__dirstream*)>>
              ((__uniq_ptr_impl<__dirstream,std::function<void(__dirstream*)>> *)&local_f0,
               (pointer)__p,(function<void_(__dirstream_*)> *)local_c8);
    ::std::_Function_base::~_Function_base((_Function_base *)local_c8);
    while( true ) {
      pdVar3 = readdir(__p);
      if (pdVar3 == (dirent *)0x0) break;
      ::std::__cxx11::string::string((string *)&local_110,pdVar3->d_name,(allocator *)local_c8);
      if (local_110._M_string_length != 0) {
        bVar1 = ::std::operator==(&local_110,".");
        if (!bVar1) {
          bVar1 = ::std::operator==(&local_110,"..");
          if (!bVar1) {
            ::std::__cxx11::string::string((string *)local_c8,__name,&local_141);
            FileSystem::JoinPath(&local_130,local_138,(string *)local_c8,(string *)&local_110);
            ::std::__cxx11::string::~string((string *)local_c8);
            iVar2 = stat(local_130._M_dataplus._M_p,(stat *)local_c8);
            if ((iVar2 == 0) && ((local_c8._24_8_ & 0xc000) != 0)) {
              std::
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              ::operator()(local_140,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_110,(bool)((byte)((uint)local_c8._24_4_ >> 0xe) & 1));
            }
            ::std::__cxx11::string::~string((string *)&local_130);
          }
        }
      }
      ::std::__cxx11::string::~string((string *)&local_110);
    }
    std::unique_ptr<__dirstream,_std::function<void_(__dirstream_*)>_>::~unique_ptr(&local_f0);
  }
  return __p != (DIR *)0x0;
}

Assistant:

bool LocalFileSystem::ListFiles(const string &directory, const std::function<void(const string &, bool)> &callback,
                                FileOpener *opener) {
	auto normalized_dir = NormalizeLocalPath(directory);
	auto dir = opendir(normalized_dir);
	if (!dir) {
		return false;
	}

	// RAII wrapper around DIR to automatically free on exceptions in callback
	std::unique_ptr<DIR, std::function<void(DIR *)>> dir_unique_ptr(dir, [](DIR *d) { closedir(d); });

	struct dirent *ent;
	// loop over all files in the directory
	while ((ent = readdir(dir)) != nullptr) {
		string name = string(ent->d_name);
		// skip . .. and empty files
		if (name.empty() || name == "." || name == "..") {
			continue;
		}
		// now stat the file to figure out if it is a regular file or directory
		string full_path = JoinPath(normalized_dir, name);
		struct stat status;
		auto res = stat(full_path.c_str(), &status);
		if (res != 0) {
			continue;
		}
		if (!(status.st_mode & S_IFREG) && !(status.st_mode & S_IFDIR)) {
			// not a file or directory: skip
			continue;
		}
		// invoke callback
		callback(name, status.st_mode & S_IFDIR);
	}

	return true;
}